

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O0

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::TPZDohrMatrix
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffe8;
  TPZMatrix<double> *in_stack_fffffffffffffff0;
  
  *(undefined8 *)((long)in_RDI + 10) = 0;
  *(undefined8 *)((long)in_RDI + 0x12) = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  TPZMatrix<double>::TPZMatrix(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__TPZDohrMatrix_025aa598;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
          *)0x1fd660d);
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_fffffffffffffff0);
  return;
}

Assistant:

TPZDohrMatrix() : TPZMatrix<TVar>()
    {
        
    }